

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_lpf_config *
ma_lpf_config_init(ma_lpf_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                  ma_uint32 sampleRate,double cutoffFrequency,ma_uint32 order)

{
  ma_uint32 mVar1;
  
  if (__return_storage_ptr__ != (ma_lpf_config *)0x0) {
    __return_storage_ptr__->format = ma_format_unknown;
    __return_storage_ptr__->channels = 0;
    *(undefined8 *)&__return_storage_ptr__->sampleRate = 0;
    __return_storage_ptr__->cutoffFrequency = 0.0;
    *(undefined8 *)&__return_storage_ptr__->order = 0;
    __return_storage_ptr__->format = format;
    __return_storage_ptr__->channels = channels;
    __return_storage_ptr__->sampleRate = sampleRate;
    __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
    mVar1 = 8;
    if (order < 8) {
      mVar1 = order;
    }
    __return_storage_ptr__->order = mVar1;
    return __return_storage_ptr__;
  }
  __assert_fail("sz == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O1/_deps/raylib-src/src/external/miniaudio.h"
                ,0x2fbb,"void ma_zero_memory_default(void *, size_t)");
}

Assistant:

static MA_INLINE void ma_zero_memory_default(void* p, size_t sz)
{
    if (p == NULL) {
        MA_ASSERT(sz == 0); /* If this is triggered there's an error with the calling code. */
        return;
    }

    if (sz > 0) {
        memset(p, 0, sz);
    }
}